

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O0

unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_> __thiscall
charls::jls_codec_factory<charls::encoder_strategy>::create_codec
          (jls_codec_factory<charls::encoder_strategy> *this,frame_info *frame,
          coding_parameters *parameters,jpegls_pc_parameters *preset_coding_parameters)

{
  bool bVar1;
  int32_t iVar2;
  pointer peVar3;
  int32_t *in_R8;
  undefined1 local_98 [20];
  default_traits<unsigned_short,_unsigned_short> traits_1;
  undefined1 local_68 [8];
  default_traits<unsigned_char,_unsigned_char> traits;
  unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_> local_40;
  undefined1 local_31;
  int32_t *local_30;
  jpegls_pc_parameters *preset_coding_parameters_local;
  coding_parameters *parameters_local;
  frame_info *frame_local;
  jls_codec_factory<charls::encoder_strategy> *this_local;
  unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_> *codec;
  
  local_31 = 0;
  local_30 = in_R8;
  preset_coding_parameters_local = preset_coding_parameters;
  parameters_local = parameters;
  frame_local = frame;
  this_local = this;
  std::unique_ptr<charls::encoder_strategy,std::default_delete<charls::encoder_strategy>>::
  unique_ptr<std::default_delete<charls::encoder_strategy>,void>
            ((unique_ptr<charls::encoder_strategy,std::default_delete<charls::encoder_strategy>> *)
             this);
  if (local_30[4] == 0x40) {
    try_create_optimized_codec
              ((jls_codec_factory<charls::encoder_strategy> *)&local_40,frame,parameters_local);
    std::unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_>::
    operator=((unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_>
               *)this,&local_40);
    std::unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_>::
    ~unique_ptr(&local_40);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (!bVar1) {
    if ((int)parameters_local->interleave_mode < 9) {
      iVar2 = calculate_maximum_sample_value(parameters_local->interleave_mode);
      default_traits<unsigned_char,_unsigned_char>::default_traits
                ((default_traits<unsigned_char,_unsigned_char> *)local_68,iVar2,
                 preset_coding_parameters_local->maximum_sample_value,local_30[4]);
      local_68._0_4_ = *local_30;
      std::
      make_unique<charls::jls_codec<charls::default_traits<unsigned_char,unsigned_char>,charls::encoder_strategy>,charls::default_traits<unsigned_char,unsigned_char>&,charls_frame_info_const&,charls::coding_parameters_const&>
                ((default_traits<unsigned_char,_unsigned_char> *)&traits_1.limit,
                 (charls_frame_info *)local_68,parameters_local);
      std::unique_ptr<charls::encoder_strategy,std::default_delete<charls::encoder_strategy>>::
      operator=((unique_ptr<charls::encoder_strategy,std::default_delete<charls::encoder_strategy>>
                 *)this,(unique_ptr<charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>,_std::default_delete<charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>_>_>
                         *)&traits_1.limit);
      std::
      unique_ptr<charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>,_std::default_delete<charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>_>_>
      ::~unique_ptr((unique_ptr<charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>,_std::default_delete<charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>_>_>
                     *)&traits_1.limit);
    }
    else {
      iVar2 = calculate_maximum_sample_value(parameters_local->interleave_mode);
      default_traits<unsigned_short,_unsigned_short>::default_traits
                ((default_traits<unsigned_short,_unsigned_short> *)(local_98 + 0xc),iVar2,
                 preset_coding_parameters_local->maximum_sample_value,local_30[4]);
      local_98._12_4_ = *local_30;
      std::
      make_unique<charls::jls_codec<charls::default_traits<unsigned_short,unsigned_short>,charls::encoder_strategy>,charls::default_traits<unsigned_short,unsigned_short>&,charls_frame_info_const&,charls::coding_parameters_const&>
                ((default_traits<unsigned_short,_unsigned_short> *)local_98,
                 (charls_frame_info *)(local_98 + 0xc),parameters_local);
      std::unique_ptr<charls::encoder_strategy,std::default_delete<charls::encoder_strategy>>::
      operator=((unique_ptr<charls::encoder_strategy,std::default_delete<charls::encoder_strategy>>
                 *)this,(unique_ptr<charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>,_std::default_delete<charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>_>_>
                         *)local_98);
      std::
      unique_ptr<charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>,_std::default_delete<charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>_>_>
      ::~unique_ptr((unique_ptr<charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>,_std::default_delete<charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>_>_>
                     *)local_98);
    }
  }
  peVar3 = std::unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_>
           ::operator->((unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_>
                         *)this);
  (*peVar3->_vptr_encoder_strategy[3])
            (peVar3,local_30,(ulong)(uint)preset_coding_parameters_local->threshold1);
  return (__uniq_ptr_data<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>,_true,_true>
          )(__uniq_ptr_data<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>,_true,_true>
            )this;
}

Assistant:

unique_ptr<Strategy> jls_codec_factory<Strategy>::create_codec(const frame_info& frame, const coding_parameters& parameters,
                                                               const jpegls_pc_parameters& preset_coding_parameters)
{
    unique_ptr<Strategy> codec;

    if (preset_coding_parameters.reset_value == default_reset_value)
    {
        codec = try_create_optimized_codec(frame, parameters);
    }

    if (!codec)
    {
        if (frame.bits_per_sample <= 8)
        {
            default_traits<uint8_t, uint8_t> traits(calculate_maximum_sample_value(frame.bits_per_sample),
                                                    parameters.near_lossless, preset_coding_parameters.reset_value);
            traits.maximum_sample_value = preset_coding_parameters.maximum_sample_value;
            codec = make_unique<jls_codec<default_traits<uint8_t, uint8_t>, Strategy>>(traits, frame, parameters);
        }
        else
        {
            default_traits<uint16_t, uint16_t> traits(calculate_maximum_sample_value(frame.bits_per_sample),
                                                      parameters.near_lossless, preset_coding_parameters.reset_value);
            traits.maximum_sample_value = preset_coding_parameters.maximum_sample_value;
            codec = make_unique<jls_codec<default_traits<uint16_t, uint16_t>, Strategy>>(traits, frame, parameters);
        }
    }

    codec->set_presets(preset_coding_parameters, parameters.restart_interval);
    return codec;
}